

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

AssertionResult __thiscall
testing::internal::
CmpHelperEQFailure<std::reverse_iterator<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,true>>,std::pair<int_const,int>&,std::pair<int_const,int>*>>,std::reverse_iterator<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,true>>const,std::pair<int_const,int>const&,std::pair<int_const,int>const*>>>
          (internal *this,char *lhs_expression,char *rhs_expression,
          reverse_iterator<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>_>
          *lhs,reverse_iterator<phmap::priv::btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>,_const_std::pair<const_int,_int>_&,_const_std::pair<const_int,_int>_*>_>
               *rhs)

{
  reverse_iterator<phmap::priv::btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>,_const_std::pair<const_int,_int>_&,_const_std::pair<const_int,_int>_*>_>
  *value;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_00;
  AssertionResult AVar2;
  string local_60;
  string local_40;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var1;
  
  PrintToString<std::reverse_iterator<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,true>>,std::pair<int_const,int>&,std::pair<int_const,int>*>>>
            (&local_40,(testing *)lhs,
             (reverse_iterator<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>_>
              *)rhs_expression);
  PrintToString<std::reverse_iterator<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,true>>const,std::pair<int_const,int>const&,std::pair<int_const,int>const*>>>
            (&local_60,(testing *)rhs,value);
  AVar2 = EqFailure(this,lhs_expression,rhs_expression,&local_40,&local_60,false);
  _Var1._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       AVar2.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    _Var1 = extraout_RDX.
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    _Var1._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         extraout_RDX_00.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  }
  AVar2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )_Var1._M_head_impl;
  AVar2._0_8_ = this;
  return AVar2;
}

Assistant:

AssertionResult CmpHelperEQFailure(const char* lhs_expression,
                                   const char* rhs_expression, const T1& lhs,
                                   const T2& rhs) {
  return EqFailure(lhs_expression, rhs_expression,
                   FormatForComparisonFailureMessage(lhs, rhs),
                   FormatForComparisonFailureMessage(rhs, lhs), false);
}